

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HFactor.h
# Opt level: O2

void __thiscall HFactor::clinkDel(HFactor *this,HighsInt index)

{
  int iVar1;
  int iVar2;
  pointer piVar3;
  pointer piVar4;
  long lVar5;
  int *piVar6;
  
  piVar3 = (this->col_link_last).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar1 = piVar3[index];
  lVar5 = (long)iVar1;
  piVar4 = (this->col_link_next).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar2 = piVar4[index];
  piVar6 = piVar4 + lVar5;
  if (lVar5 < 0) {
    piVar6 = (this->col_link_first).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start + (-2 - lVar5);
  }
  *piVar6 = iVar2;
  if (-1 < (long)iVar2) {
    piVar3[iVar2] = iVar1;
  }
  return;
}

Assistant:

void clinkDel(const HighsInt index) {
    const HighsInt xlast = col_link_last[index];
    const HighsInt xnext = col_link_next[index];
    if (xlast >= 0)
      col_link_next[xlast] = xnext;
    else
      col_link_first[-xlast - 2] = xnext;
    if (xnext >= 0) col_link_last[xnext] = xlast;
  }